

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

pair<spv::StorageClass,_spv::StorageClass>
spvtools::val::anon_unknown_2::GetStorageClass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  uint uVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  pair<spv::StorageClass,_spv::StorageClass> pVar6;
  Instruction *src_type;
  Instruction *src;
  Instruction *dst_type;
  Instruction *dst;
  Instruction *store_pointer_type;
  Instruction *store_pointer;
  Instruction *load_pointer_type;
  Instruction *load_pointer;
  StorageClass src_sc;
  StorageClass dst_sc;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  load_pointer._4_4_ = Max;
  load_pointer._0_4_ = Max;
  _src_sc = inst;
  inst_local = (Instruction *)_;
  OVar1 = Instruction::opcode(inst);
  pIVar5 = inst_local;
  if (OVar1 == OpLoad) goto LAB_00229084;
  if (OVar1 == OpStore) goto LAB_002290df;
  if (OVar1 - OpCopyMemory < 2) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(_src_sc,0);
    pIVar4 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar2);
    pIVar5 = inst_local;
    uVar3 = Instruction::type_id(pIVar4);
    pIVar5 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar3);
    load_pointer._4_4_ = Instruction::GetOperandAs<spv::StorageClass>(pIVar5,1);
    pIVar5 = inst_local;
    uVar2 = Instruction::GetOperandAs<unsigned_int>(_src_sc,1);
    pIVar4 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar2);
    pIVar5 = inst_local;
    uVar3 = Instruction::type_id(pIVar4);
    pIVar5 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar3);
    load_pointer._0_4_ = Instruction::GetOperandAs<spv::StorageClass>(pIVar5,1);
    goto LAB_00229206;
  }
  if (OVar1 == OpCooperativeMatrixLoadKHR) {
LAB_00229084:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(_src_sc,2);
    pIVar4 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar2);
    pIVar5 = inst_local;
    uVar3 = Instruction::type_id(pIVar4);
    pIVar5 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar3);
    load_pointer._4_4_ = Instruction::GetOperandAs<spv::StorageClass>(pIVar5,1);
  }
  else {
    if (OVar1 != OpCooperativeMatrixStoreKHR) {
      if (OVar1 == OpCooperativeMatrixLoadNV) goto LAB_00229084;
      if (OVar1 != OpCooperativeMatrixStoreNV) {
        if (OVar1 == OpCooperativeMatrixLoadTensorNV) goto LAB_00229084;
        if (OVar1 != OpCooperativeMatrixStoreTensorNV) goto LAB_00229206;
      }
    }
LAB_002290df:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(_src_sc,0);
    pIVar4 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar2);
    pIVar5 = inst_local;
    uVar3 = Instruction::type_id(pIVar4);
    pIVar5 = ValidationState_t::FindDef((ValidationState_t *)pIVar5,uVar3);
    load_pointer._4_4_ = Instruction::GetOperandAs<spv::StorageClass>(pIVar5,1);
  }
LAB_00229206:
  pVar6 = std::make_pair<spv::StorageClass&,spv::StorageClass&>
                    ((StorageClass *)((long)&load_pointer + 4),(StorageClass *)&load_pointer);
  return pVar6;
}

Assistant:

std::pair<spv::StorageClass, spv::StorageClass> GetStorageClass(
    ValidationState_t& _, const Instruction* inst) {
  spv::StorageClass dst_sc = spv::StorageClass::Max;
  spv::StorageClass src_sc = spv::StorageClass::Max;
  switch (inst->opcode()) {
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpLoad: {
      auto load_pointer = _.FindDef(inst->GetOperandAs<uint32_t>(2));
      auto load_pointer_type = _.FindDef(load_pointer->type_id());
      dst_sc = load_pointer_type->GetOperandAs<spv::StorageClass>(1);
      break;
    }
    case spv::Op::OpCooperativeMatrixStoreNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
    case spv::Op::OpCooperativeMatrixStoreKHR:
    case spv::Op::OpStore: {
      auto store_pointer = _.FindDef(inst->GetOperandAs<uint32_t>(0));
      auto store_pointer_type = _.FindDef(store_pointer->type_id());
      dst_sc = store_pointer_type->GetOperandAs<spv::StorageClass>(1);
      break;
    }
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized: {
      auto dst = _.FindDef(inst->GetOperandAs<uint32_t>(0));
      auto dst_type = _.FindDef(dst->type_id());
      dst_sc = dst_type->GetOperandAs<spv::StorageClass>(1);
      auto src = _.FindDef(inst->GetOperandAs<uint32_t>(1));
      auto src_type = _.FindDef(src->type_id());
      src_sc = src_type->GetOperandAs<spv::StorageClass>(1);
      break;
    }
    default:
      break;
  }

  return std::make_pair(dst_sc, src_sc);
}